

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

int GPU_GetNumRegisteredRenderers(void)

{
  int iVar1;
  long lVar2;
  
  gpu_init_renderer_register();
  iVar1 = 0;
  lVar2 = 8;
  do {
    iVar1 = (iVar1 + 1) - (uint)(*(int *)((long)&_gpu_renderer_register[0].id.name + lVar2) == 0);
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x198);
  return iVar1;
}

Assistant:

int GPU_GetNumRegisteredRenderers(void)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer != GPU_RENDERER_UNKNOWN)
			count++;
	}
	return count;
}